

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

void __thiscall
ON_SubDMeshFragmentIterator::ON_SubDMeshFragmentIterator
          (ON_SubDMeshFragmentIterator *this,ON_SubDFaceIterator *fit)

{
  ON_SubD *other_subd;
  ON_SubDFaceIterator *fit_local;
  ON_SubDMeshFragmentIterator *this_local;
  
  ON_SubDMesh::ON_SubDMesh(&this->m_limit_mesh);
  ON_SubD::ON_SubD(&this->m_subd);
  ON_SubDFaceIterator::ON_SubDFaceIterator(&this->m_fit);
  this->m_current_fragment = (ON_SubDMeshFragment *)0x0;
  this->m_bFromFaceFragments = false;
  this->m_bHaveCounts = false;
  this->m_subd_appearance_override = Unset;
  this->m_reserved_density_reduction = '\0';
  this->m_maximum_mesh_density = 0;
  this->m_full_size_fragment_count = 0;
  this->m_half_size_fragment_count = 0;
  other_subd = ON_SubDFaceIterator::SubD(fit);
  ON_SubD::ShareDimple(&this->m_subd,other_subd);
  ON_SubDFaceIterator::operator=(&this->m_fit,fit);
  this->m_bFromFaceFragments = true;
  return;
}

Assistant:

ON_SubDMeshFragmentIterator::ON_SubDMeshFragmentIterator(const ON_SubDFaceIterator& fit)
{
  m_subd.ShareDimple(fit.SubD());
  m_fit = fit;
  m_bFromFaceFragments = true;
}